

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emmy_facade.cpp
# Opt level: O0

int __thiscall EmmyFacade::OnDisconnect(EmmyFacade *this)

{
  EmmyFacade *this_local;
  
  this->isIDEReady = false;
  this->isWaitingForIDE = false;
  EmmyDebuggerManager::OnDisconnect(&this->_emmyDebuggerManager);
  EmmyDebuggerManager::RemoveAllBreakpoints(&this->_emmyDebuggerManager);
  if (this->workMode == Attach) {
    EmmyDebuggerManager::RemoveAllDebugger(&this->_emmyDebuggerManager);
  }
  return 0;
}

Assistant:

int EmmyFacade::OnDisconnect() {
	isIDEReady = false;
	isWaitingForIDE = false;

	_emmyDebuggerManager.OnDisconnect();

	_emmyDebuggerManager.RemoveAllBreakpoints();

	if (workMode == WorkMode::Attach) {
		_emmyDebuggerManager.RemoveAllDebugger();
	}

	return 0;
}